

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalUnixMakefileGenerator3.cxx
# Opt level: O2

void __thiscall
cmGlobalUnixMakefileGenerator3::InitializeProgressMarks(cmGlobalUnixMakefileGenerator3 *this)

{
  cmGeneratorTarget *this_00;
  bool bVar1;
  TargetType TVar2;
  pointer ppcVar3;
  cmLocalGenerator *this_01;
  _Rb_tree<cmGeneratorTarget_const*,cmGeneratorTarget_const*,std::_Identity<cmGeneratorTarget_const*>,std::less<cmGeneratorTarget_const*>,std::allocator<cmGeneratorTarget_const*>>
  *this_02;
  TargetDependSet *pTVar4;
  _Base_ptr p_Var5;
  cmGeneratorTarget *gt;
  vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_> targets;
  cmStateSnapshot csnp;
  cmStateSnapshot tsnp;
  cmGeneratorTarget *local_c0;
  pointer local_b8;
  cmLocalGenerator *local_b0;
  pointer local_a8;
  map<cmStateSnapshot,_std::set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>,_cmStateSnapshot::StrictWeakOrder,_std::allocator<std::pair<const_cmStateSnapshot,_std::set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>_>_>_>
  *local_a0;
  _Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_> local_98;
  cmStateSnapshot local_80;
  string local_68;
  cmStateSnapshot local_48;
  
  local_a0 = &this->DirectoryTargetsMap;
  std::
  _Rb_tree<cmStateSnapshot,_std::pair<const_cmStateSnapshot,_std::set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>_>,_std::_Select1st<std::pair<const_cmStateSnapshot,_std::set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>_>_>,_cmStateSnapshot::StrictWeakOrder,_std::allocator<std::pair<const_cmStateSnapshot,_std::set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>_>_>_>
  ::clear(&local_a0->_M_t);
  local_b8 = (this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.LocalGenerators.
             super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>._M_impl.
             super__Vector_impl_data._M_start;
  do {
    if (local_b8 ==
        (this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.LocalGenerators.
        super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      return;
    }
    local_b0 = *local_b8;
    std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>::vector
              ((vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_> *)&local_98,
               &local_b0->GeneratorTargets);
    ppcVar3 = local_98._M_impl.super__Vector_impl_data._M_start;
    while (ppcVar3 != local_98._M_impl.super__Vector_impl_data._M_finish) {
      local_c0 = *ppcVar3;
      local_a8 = ppcVar3;
      this_01 = cmGeneratorTarget::GetLocalGenerator(local_c0);
      TVar2 = cmGeneratorTarget::GetType(local_c0);
      this_00 = local_c0;
      if (TVar2 != INTERFACE_LIBRARY) {
        std::__cxx11::string::string((string *)&local_68,"EXCLUDE_FROM_ALL",(allocator *)&local_48);
        bVar1 = cmGeneratorTarget::GetPropertyAsBool(this_00,&local_68);
        std::__cxx11::string::~string((string *)&local_68);
        if (!bVar1) {
          cmLocalGenerator::GetStateSnapshot((cmStateSnapshot *)&local_68,local_b0);
          cmLocalGenerator::GetStateSnapshot(&local_48,this_01);
          while( true ) {
            bVar1 = cmStateSnapshot::IsValid((cmStateSnapshot *)&local_68);
            if (!bVar1) break;
            bVar1 = cmGlobalGenerator::IsExcluded
                              ((cmGlobalGenerator *)this,(cmStateSnapshot *)&local_68,&local_48);
            if (bVar1) break;
            this_02 = (_Rb_tree<cmGeneratorTarget_const*,cmGeneratorTarget_const*,std::_Identity<cmGeneratorTarget_const*>,std::less<cmGeneratorTarget_const*>,std::allocator<cmGeneratorTarget_const*>>
                       *)std::
                         map<cmStateSnapshot,_std::set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>,_cmStateSnapshot::StrictWeakOrder,_std::allocator<std::pair<const_cmStateSnapshot,_std::set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>_>_>_>
                         ::operator[](local_a0,(key_type *)&local_68);
            std::
            _Rb_tree<cmGeneratorTarget_const*,cmGeneratorTarget_const*,std::_Identity<cmGeneratorTarget_const*>,std::less<cmGeneratorTarget_const*>,std::allocator<cmGeneratorTarget_const*>>
            ::_M_insert_unique<cmGeneratorTarget_const*const&>(this_02,&local_c0);
            pTVar4 = cmGlobalGenerator::GetTargetDirectDepends((cmGlobalGenerator *)this,local_c0);
            for (p_Var5 = (pTVar4->
                          super_set<cmTargetDepend,_std::less<cmTargetDepend>,_std::allocator<cmTargetDepend>_>
                          )._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
                (_Rb_tree_header *)p_Var5 !=
                &(pTVar4->
                 super_set<cmTargetDepend,_std::less<cmTargetDepend>,_std::allocator<cmTargetDepend>_>
                 )._M_t._M_impl.super__Rb_tree_header;
                p_Var5 = (_Base_ptr)std::_Rb_tree_increment(p_Var5)) {
              local_80.State = *(cmState **)(p_Var5 + 1);
              std::
              _Rb_tree<cmGeneratorTarget_const*,cmGeneratorTarget_const*,std::_Identity<cmGeneratorTarget_const*>,std::less<cmGeneratorTarget_const*>,std::allocator<cmGeneratorTarget_const*>>
              ::_M_insert_unique<cmGeneratorTarget_const*>(this_02,(cmGeneratorTarget **)&local_80);
            }
            cmStateSnapshot::GetBuildsystemDirectoryParent(&local_80,(cmStateSnapshot *)&local_68);
            local_68._M_dataplus._M_p = (pointer)local_80.State;
          }
        }
      }
      ppcVar3 = local_a8 + 1;
    }
    std::_Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>::~_Vector_base
              (&local_98);
    local_b8 = local_b8 + 1;
  } while( true );
}

Assistant:

void cmGlobalUnixMakefileGenerator3::InitializeProgressMarks()
{
  this->DirectoryTargetsMap.clear();
  // Loop over all targets in all local generators.
  for (std::vector<cmLocalGenerator*>::const_iterator lgi =
         this->LocalGenerators.begin();
       lgi != this->LocalGenerators.end(); ++lgi) {
    cmLocalGenerator* lg = *lgi;
    std::vector<cmGeneratorTarget*> targets = lg->GetGeneratorTargets();
    for (std::vector<cmGeneratorTarget*>::const_iterator t = targets.begin();
         t != targets.end(); ++t) {
      cmGeneratorTarget* gt = *t;

      cmLocalGenerator* tlg = gt->GetLocalGenerator();

      if (gt->GetType() == cmStateEnums::INTERFACE_LIBRARY ||
          gt->GetPropertyAsBool("EXCLUDE_FROM_ALL")) {
        continue;
      }

      cmStateSnapshot csnp = lg->GetStateSnapshot();
      cmStateSnapshot tsnp = tlg->GetStateSnapshot();

      // Consider the directory containing the target and all its
      // parents until something excludes the target.
      for (; csnp.IsValid() && !this->IsExcluded(csnp, tsnp);
           csnp = csnp.GetBuildsystemDirectoryParent()) {
        // This local generator includes the target.
        std::set<cmGeneratorTarget const*>& targetSet =
          this->DirectoryTargetsMap[csnp];
        targetSet.insert(gt);

        // Add dependencies of the included target.  An excluded
        // target may still be included if it is a dependency of a
        // non-excluded target.
        TargetDependSet const& tgtdeps = this->GetTargetDirectDepends(gt);
        for (TargetDependSet::const_iterator ti = tgtdeps.begin();
             ti != tgtdeps.end(); ++ti) {
          targetSet.insert(*ti);
        }
      }
    }
  }
}